

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::ReflectionOpsTest_FindExtensionInitializationErrors_Test
::~ReflectionOpsTest_FindExtensionInitializationErrors_Test
          (ReflectionOpsTest_FindExtensionInitializationErrors_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ReflectionOpsTest, FindExtensionInitializationErrors) {
  unittest::TestAllExtensions message;
  message.MutableExtension(unittest::TestRequired::single);
  message.AddExtension(unittest::TestRequired::multi);
  message.AddExtension(unittest::TestRequired::multi);
  EXPECT_EQ(
      "(proto2_unittest.TestRequired.single).a,"
      "(proto2_unittest.TestRequired.single).b,"
      "(proto2_unittest.TestRequired.single).c,"
      "(proto2_unittest.TestRequired.multi)[0].a,"
      "(proto2_unittest.TestRequired.multi)[0].b,"
      "(proto2_unittest.TestRequired.multi)[0].c,"
      "(proto2_unittest.TestRequired.multi)[1].a,"
      "(proto2_unittest.TestRequired.multi)[1].b,"
      "(proto2_unittest.TestRequired.multi)[1].c",
      FindInitializationErrors(message));
}